

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idna.c
# Opt level: O0

uint uv__utf8_decode1(char **p,char *pe)

{
  byte *pbVar1;
  uint a;
  char *pe_local;
  char **p_local;
  
  if (pe <= *p) {
    __assert_fail("*p < pe",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/src/idna.c"
                  ,0x5e,"unsigned int uv__utf8_decode1(const char **, const char *)");
  }
  pbVar1 = (byte *)*p;
  *p = (char *)(pbVar1 + 1);
  p_local._4_4_ = (uint)*pbVar1;
  if (0x7f < p_local._4_4_) {
    p_local._4_4_ = uv__utf8_decode1_slow(p,pe,p_local._4_4_);
  }
  return p_local._4_4_;
}

Assistant:

unsigned uv__utf8_decode1(const char** p, const char* pe) {
  unsigned a;

  assert(*p < pe);

  a = (unsigned char) *(*p)++;

  if (a < 128)
    return a;  /* ASCII, common case. */

  return uv__utf8_decode1_slow(p, pe, a);
}